

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O1

Builder * __thiscall
arangodb::velocypack::Builder::closeArray
          (Builder *this,ValueLength pos,iterator indexStart,iterator indexEnd)

{
  ValueLength *pVVar1;
  unsigned_long *puVar2;
  PaddingBehavior PVar3;
  pointer pCVar4;
  bool bVar5;
  long lVar6;
  ValueLength subLen;
  byte *pbVar7;
  ValueLength VVar8;
  ulong uVar9;
  ulong uVar10;
  pointer puVar11;
  byte bVar12;
  byte bVar13;
  size_t __n;
  long lVar14;
  unsigned_long uVar15;
  uint uVar16;
  ulong uVar17;
  ValueLength VVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  size_t distance;
  ulong uVar22;
  bool bVar23;
  
  lVar20 = (long)indexEnd._M_current - (long)indexStart._M_current;
  uVar22 = lVar20 >> 3;
  if (lVar20 == 8) {
    bVar23 = false;
  }
  else {
    lVar14 = indexStart._M_current[1] - *indexStart._M_current;
    bVar23 = true;
    if (((this->_pos - *indexStart._M_current) - pos == lVar14 * uVar22) &&
       (this->_pos - (indexStart._M_current[uVar22 - 1] + pos) == lVar14)) {
      uVar21 = uVar22 - 1;
      uVar9 = 1;
      do {
        if (uVar21 + (uVar21 == 0) == uVar9) {
          bVar23 = uVar9 < uVar21;
          break;
        }
        lVar6 = uVar9 + 1;
        puVar2 = indexStart._M_current + uVar9;
        uVar9 = uVar9 + 1;
      } while (indexStart._M_current[lVar6] - *puVar2 == lVar14);
    }
  }
  pbVar7 = this->_start + pos;
  PVar3 = this->options->paddingBehavior;
  if (PVar3 - NoPadding < 2) {
    uVar9 = 6;
    if (uVar22 < 6) {
      uVar9 = uVar22;
    }
    uVar21 = (ulong)(indexEnd._M_current == indexStart._M_current);
    if ((indexEnd._M_current != indexStart._M_current) && (pbVar7[*indexStart._M_current] != 0)) {
      uVar21 = 1;
      do {
        uVar10 = uVar21;
        if (uVar9 == uVar10) break;
        uVar21 = uVar10 + 1;
      } while (pbVar7[indexStart._M_current[uVar10]] != 0);
      uVar21 = (ulong)(uVar9 <= uVar10);
    }
  }
  else {
    uVar21 = 0;
  }
  lVar14 = this->_pos - pos;
  uVar10 = 0;
  uVar9 = 0;
  if (bVar23 != false) {
    uVar9 = uVar22;
  }
  uVar17 = (ulong)bVar23 - 7;
  if ((char)uVar21 == '\0') {
    uVar17 = uVar10;
  }
  if (uVar17 + uVar9 + lVar14 < 0x100) {
    uVar19 = 1;
  }
  else {
    if (PVar3 == NoPadding) {
      uVar9 = 4;
      if (uVar22 < 4) {
        uVar9 = uVar22;
      }
      uVar21 = (ulong)(indexEnd._M_current == indexStart._M_current);
      if ((indexEnd._M_current != indexStart._M_current) && (pbVar7[*indexStart._M_current] != 0)) {
        uVar21 = 1;
        do {
          uVar10 = uVar21;
          if (uVar9 == uVar10) break;
          uVar21 = uVar10 + 1;
        } while (pbVar7[indexStart._M_current[uVar10]] != 0);
        uVar21 = (ulong)(uVar9 <= uVar10);
      }
    }
    else {
      uVar21 = 0;
    }
    uVar10 = 0;
    uVar9 = lVar20 >> 2;
    if (bVar23 == false) {
      uVar9 = uVar10;
    }
    uVar17 = (ulong)bVar23 * 2 - 6;
    if ((char)uVar21 == '\0') {
      uVar17 = uVar10;
    }
    if (uVar17 + uVar9 + lVar14 < 0x10000) {
      uVar19 = 2;
    }
    else {
      uVar21 = 0;
      uVar9 = lVar20 >> 1;
      if (bVar23 == false) {
        uVar9 = uVar21;
      }
      bVar5 = lVar14 + uVar9 >> 0x20 != 0;
      uVar10 = (ulong)bVar5;
      uVar19 = (uint)bVar5 * 4 + 4;
    }
  }
  bVar12 = (byte)uVar21;
  uVar16 = uVar19;
  if ((char)uVar10 != '\0') {
    uVar16 = 8;
  }
  if (bVar23 == false && (char)uVar10 == '\0') {
    uVar16 = 8;
    if (PVar3 != UsePadding) {
      uVar16 = uVar19;
    }
    bVar12 = PVar3 != UsePadding & bVar12;
  }
  uVar21 = (ulong)uVar16;
  bVar13 = bVar23 * '\x04' | 2;
  if (uVar16 == 8) {
    bVar13 = bVar13 + 3;
  }
  else if (uVar16 == 4) {
    bVar13 = bVar13 + 2;
  }
  else if (uVar16 == 2) {
    bVar13 = bVar23 * '\x04' | 3;
  }
  *pbVar7 = bVar13;
  if (bVar12 != 0) {
    uVar9 = 0;
    if (bVar23 == false) {
      uVar9 = uVar21;
    }
    lVar20 = (uVar21 * 2 + 1) - uVar9;
    __n = this->_pos - (pos + 9);
    if (pos + 9 <= this->_pos && __n != 0) {
      memmove(this->_start + lVar20 + pos,this->_start + pos + 9,__n);
    }
    lVar20 = 9 - lVar20;
    this->_pos = this->_pos - lVar20;
    pVVar1 = &this->_bufferPtr->_size;
    *pVVar1 = *pVVar1 - lVar20;
    if (bVar23 == false) goto LAB_001095d0;
    if (indexEnd._M_current != indexStart._M_current) {
      lVar14 = 0;
      do {
        indexStart._M_current[lVar14] = indexStart._M_current[lVar14] - lVar20;
        lVar14 = lVar14 + 1;
      } while (uVar22 + (uVar22 == 0) != lVar14);
    }
  }
  if (bVar23 != false) {
    lVar20 = uVar22 * uVar21;
    reserve(this,(ulong)(uVar21 == 8) * 8 + lVar20);
    VVar8 = this->_pos;
    this->_pos = VVar8 + lVar20;
    pVVar1 = &this->_bufferPtr->_size;
    *pVVar1 = *pVVar1 + lVar20;
    if (indexEnd._M_current != indexStart._M_current) {
      lVar20 = 0;
      do {
        uVar15 = indexStart._M_current[lVar20];
        VVar18 = VVar8;
        lVar14 = uVar21 + (uVar21 == 0);
        do {
          this->_start[VVar18] = (uint8_t)uVar15;
          uVar15 = uVar15 >> 8;
          VVar18 = VVar18 + 1;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
        lVar20 = lVar20 + 1;
        VVar8 = VVar8 + uVar21;
      } while (lVar20 != uVar22 + (uVar22 == 0));
    }
  }
LAB_001095d0:
  if (uVar16 == 8 && (bVar23 ^ 1U) == 0) {
    lVar20 = 8;
    reserve(this,8);
    uVar9 = uVar22;
    do {
      VVar8 = this->_pos;
      this->_pos = VVar8 + 1;
      this->_start[VVar8] = (uint8_t)uVar9;
      pVVar1 = &this->_bufferPtr->_size;
      *pVVar1 = *pVVar1 + 1;
      uVar9 = uVar9 >> 8;
      lVar20 = lVar20 + -1;
    } while (lVar20 != 0);
  }
  uVar10 = this->_pos - pos;
  uVar9 = uVar21;
  VVar8 = pos;
  do {
    this->_start[VVar8 + 1] = (uint8_t)uVar10;
    uVar10 = uVar10 >> 8;
    VVar8 = VVar8 + 1;
    uVar9 = uVar9 - 1;
  } while (uVar9 != 0);
  if ((bVar23 ^ 1U) == 0 && uVar16 < 8) {
    do {
      this->_start[uVar21 + pos + 1] = (uint8_t)uVar22;
      uVar21 = uVar21 + 1;
      uVar22 = uVar22 >> 8;
    } while (uVar21 < uVar16 * 2);
  }
  pCVar4 = (this->_stack).
           super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  VVar8 = pCVar4[-1].indexStartPos;
  (this->_stack).
  super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = pCVar4 + -1;
  puVar11 = (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start + VVar8;
  if (puVar11 !=
      (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (this->_indexes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar11;
  }
  return this;
}

Assistant:

Builder& Builder::closeArray(ValueLength pos,
                             std::vector<ValueLength>::iterator indexStart,
                             std::vector<ValueLength>::iterator indexEnd) {
  std::size_t const n = std::distance(indexStart, indexEnd);
  VELOCYPACK_ASSERT(n > 0);

  bool needIndexTable = true;
  bool needNrSubs = true;

  if (n == 1) {
    // just one array entry
    needIndexTable = false;
    needNrSubs = false;
  } else if ((_pos - pos) - indexStart[0] ==
             n * (indexStart[1] - indexStart[0])) {
    // In this case it could be that all entries have the same length
    // and we do not need an offset table at all:
    bool buildIndexTable = false;
    ValueLength const subLen = indexStart[1] - indexStart[0];
    if ((_pos - pos) - indexStart[n - 1] != subLen) {
      buildIndexTable = true;
    } else {
      for (std::size_t i = 1; i < n - 1; i++) {
        if (indexStart[i + 1] - indexStart[i] != subLen) {
          // different lengths
          buildIndexTable = true;
          break;
        }
      }
    }

    if (!buildIndexTable) {
      needIndexTable = false;
      needNrSubs = false;
    }
  }

  VELOCYPACK_ASSERT(needIndexTable == needNrSubs);

  // First determine byte length and its format:
  unsigned int offsetSize;
  // can be 1, 2, 4 or 8 for the byte width of the offsets,
  // the byte length and the number of subvalues:
  bool allowMemmove =
      ::isAllowedToMemmove(options, _start + pos, indexStart, indexEnd, 1);
  if (_pos - pos + (needIndexTable ? n : 0) -
          (allowMemmove ? (needNrSubs ? 6 : 7) : 0) <=
      0xff) {
    // We have so far used _pos - pos bytes, including the reserved 8
    // bytes for byte length and number of subvalues. In the 1-byte number
    // case we would win back 6 bytes but would need one byte per subvalue
    // for the index table
    offsetSize = 1;
  } else {
    allowMemmove =
        ::isAllowedToMemmove(options, _start + pos, indexStart, indexEnd, 2);
    if (_pos - pos + (needIndexTable ? 2 * n : 0) -
            (allowMemmove ? (needNrSubs ? 4 : 6) : 0) <=
        0xffff) {
      offsetSize = 2;
    } else {
      allowMemmove = false;
      if (_pos - pos + (needIndexTable ? 4 * n : 0) <= 0xffffffffu) {
        offsetSize = 4;
      } else {
        offsetSize = 8;
      }
    }
  }

  VELOCYPACK_ASSERT(offsetSize == 1 || offsetSize == 2 || offsetSize == 4 ||
                    offsetSize == 8);
  VELOCYPACK_ASSERT(!allowMemmove || offsetSize == 1 || offsetSize == 2);

  if (offsetSize < 8 && !needIndexTable &&
      options->paddingBehavior == Options::PaddingBehavior::UsePadding) {
    // if we are allowed to use padding, we will pad to 8 bytes anyway. as we
    // are not using an index table, we can also use type 0x05 for all Arrays
    // without making things worse space-wise
    offsetSize = 8;
    allowMemmove = false;
  }

  // fix head byte
  _start[pos] = ::determineArrayType(needIndexTable, offsetSize);

  // Maybe we need to move down data:
  if (allowMemmove) {
    // check if one of the first entries in the array is ValueType::None
    // (0x00). in this case, we could not distinguish between a None (0x00)
    // and the optional padding. so we must prevent the memmove here
    ValueLength targetPos = 1 + 2 * offsetSize;
    if (!needIndexTable) {
      targetPos -= offsetSize;
    }
    if (_pos > (pos + 9)) {
      ValueLength len = _pos - (pos + 9);
      memmove(_start + pos + targetPos, _start + pos + 9, checkOverflow(len));
    }
    ValueLength const diff = 9 - targetPos;
    rollback(diff);
    if (needIndexTable) {
      for (std::size_t i = 0; i < n; i++) {
        indexStart[i] -= diff;
      }
    }  // Note: if !needIndexTable the index array is now wrong!
  }

  // Now build the table:
  if (needIndexTable) {
    reserve(offsetSize * n + (offsetSize == 8 ? 8 : 0));
    ValueLength tableBase = _pos;
    advance(offsetSize * n);
    for (std::size_t i = 0; i < n; i++) {
      uint64_t x = indexStart[i];
      for (std::size_t j = 0; j < offsetSize; j++) {
        _start[tableBase + offsetSize * i + j] = x & 0xff;
        x >>= 8;
      }
    }
  }

  // Finally fix the byte width at tthe end:
  if (offsetSize == 8 && needNrSubs) {
    reserve(8);
    appendLengthUnchecked<8>(n);
  }

  // Fix the byte length in the beginning:
  ValueLength x = _pos - pos;
  for (unsigned int i = 1; i <= offsetSize; i++) {
    _start[pos + i] = x & 0xff;
    x >>= 8;
  }

  if (offsetSize < 8 && needNrSubs) {
    x = n;
    for (unsigned int i = offsetSize + 1; i <= 2 * offsetSize; i++) {
      _start[pos + i] = x & 0xff;
      x >>= 8;
    }
  }

  // Now the array or object is complete, we pop a ValueLength
  // off the _stack:
  closeLevel();
  return *this;
}